

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.hh
# Opt level: O1

void __thiscall
OpenMesh::
PropertyT<OpenMesh::DefaultTraits::VertexT<OpenMesh::FinalMeshItemsT<MyTraits,_true>::ITraits,_OpenMesh::FinalMeshItemsT<MyTraits,_true>::Refs>_>
::clear(PropertyT<OpenMesh::DefaultTraits::VertexT<OpenMesh::FinalMeshItemsT<MyTraits,_true>::ITraits,_OpenMesh::FinalMeshItemsT<MyTraits,_true>::Refs>_>
        *this)

{
  pointer pVVar1;
  
  pVVar1 = (this->data_).
           super__Vector_base<OpenMesh::DefaultTraits::VertexT<OpenMesh::FinalMeshItemsT<MyTraits,_true>::ITraits,_OpenMesh::FinalMeshItemsT<MyTraits,_true>::Refs>,_std::allocator<OpenMesh::DefaultTraits::VertexT<OpenMesh::FinalMeshItemsT<MyTraits,_true>::ITraits,_OpenMesh::FinalMeshItemsT<MyTraits,_true>::Refs>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->data_).
      super__Vector_base<OpenMesh::DefaultTraits::VertexT<OpenMesh::FinalMeshItemsT<MyTraits,_true>::ITraits,_OpenMesh::FinalMeshItemsT<MyTraits,_true>::Refs>,_std::allocator<OpenMesh::DefaultTraits::VertexT<OpenMesh::FinalMeshItemsT<MyTraits,_true>::ITraits,_OpenMesh::FinalMeshItemsT<MyTraits,_true>::Refs>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pVVar1) {
    (this->data_).
    super__Vector_base<OpenMesh::DefaultTraits::VertexT<OpenMesh::FinalMeshItemsT<MyTraits,_true>::ITraits,_OpenMesh::FinalMeshItemsT<MyTraits,_true>::Refs>,_std::allocator<OpenMesh::DefaultTraits::VertexT<OpenMesh::FinalMeshItemsT<MyTraits,_true>::ITraits,_OpenMesh::FinalMeshItemsT<MyTraits,_true>::Refs>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pVVar1;
  }
  (this->data_).
  super__Vector_base<OpenMesh::DefaultTraits::VertexT<OpenMesh::FinalMeshItemsT<MyTraits,_true>::ITraits,_OpenMesh::FinalMeshItemsT<MyTraits,_true>::Refs>,_std::allocator<OpenMesh::DefaultTraits::VertexT<OpenMesh::FinalMeshItemsT<MyTraits,_true>::ITraits,_OpenMesh::FinalMeshItemsT<MyTraits,_true>::Refs>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->data_).
  super__Vector_base<OpenMesh::DefaultTraits::VertexT<OpenMesh::FinalMeshItemsT<MyTraits,_true>::ITraits,_OpenMesh::FinalMeshItemsT<MyTraits,_true>::Refs>,_std::allocator<OpenMesh::DefaultTraits::VertexT<OpenMesh::FinalMeshItemsT<MyTraits,_true>::ITraits,_OpenMesh::FinalMeshItemsT<MyTraits,_true>::Refs>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->data_).
  super__Vector_base<OpenMesh::DefaultTraits::VertexT<OpenMesh::FinalMeshItemsT<MyTraits,_true>::ITraits,_OpenMesh::FinalMeshItemsT<MyTraits,_true>::Refs>,_std::allocator<OpenMesh::DefaultTraits::VertexT<OpenMesh::FinalMeshItemsT<MyTraits,_true>::ITraits,_OpenMesh::FinalMeshItemsT<MyTraits,_true>::Refs>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pVVar1 != (pointer)0x0) {
    operator_delete(pVVar1);
    return;
  }
  return;
}

Assistant:

virtual void clear()  { data_.clear(); vector_type().swap(data_);    }